

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenRegVm_X86.cpp
# Opt level: O3

void GetCodeCmdCallEpilogue
               (CodeGenRegVmContext *ctx,uint *microcode,uchar resultReg,uchar resultType)

{
  uint *puVar1;
  uint num;
  uint uVar2;
  x86XmmReg reg1;
  uint uVar3;
  x86Reg xVar4;
  undefined7 in_register_00000009;
  x86Size size;
  uint shift;
  x86Command op;
  int iVar5;
  
  EMIT_OP_RPTR_NUM(&ctx->ctx,o_sub64,sQWORD,rR13,0x120,4);
  EMIT_OP_REG_RPTR(&ctx->ctx,o_mov64,rEBP,sQWORD,rR13,0x158);
  iVar5 = (int)CONCAT71(in_register_00000009,resultType);
  if (iVar5 == 3) {
    xVar4 = CodeGenGenericContext::GetReg(&ctx->ctx);
    EMIT_OP_REG_RPTR(&ctx->ctx,o_mov,xVar4,sDWORD,rEBP,0);
    op = o_mov;
    size = sDWORD;
  }
  else {
    if (iVar5 != 2) {
      if (iVar5 == 1) {
        reg1 = CodeGenGenericContext::GetXmmReg(&ctx->ctx);
        EMIT_OP_REG_RPTR(&ctx->ctx,o_movsd,reg1,sQWORD,rEBP,0);
        EMIT_OP_RPTR_REG(&ctx->ctx,o_movsd,sQWORD,rEBX,(uint)resultReg << 3,reg1);
      }
      goto LAB_001cd333;
    }
    xVar4 = CodeGenGenericContext::GetReg(&ctx->ctx);
    EMIT_OP_REG_RPTR(&ctx->ctx,o_mov64,xVar4,sQWORD,rEBP,0);
    op = o_mov64;
    size = sQWORD;
  }
  EMIT_OP_RPTR_REG(&ctx->ctx,op,size,rEBX,(uint)resultReg << 3,xVar4);
LAB_001cd333:
  uVar3 = *microcode;
  if (uVar3 != 7) {
    shift = 0;
    do {
      if (uVar3 == 10) {
        uVar3 = microcode[1];
        num = microcode[2];
        uVar2 = microcode[3];
        EMIT_OP_REG_RPTR(&ctx->ctx,o_lea,rESI,sQWORD,rEBP,shift);
        if (uVar3 == 3) {
          xVar4 = rEBX;
LAB_001cd484:
          EMIT_OP_REG_REG(&ctx->ctx,o_mov64,rEDI,xVar4);
        }
        else {
          if (uVar3 == 2) {
            xVar4 = rR14;
            goto LAB_001cd484;
          }
          if (uVar3 == 1) {
            xVar4 = rR15;
            goto LAB_001cd484;
          }
          EMIT_OP_REG_RPTR(&ctx->ctx,o_mov64,rEDI,sQWORD,rEBX,uVar3 << 3);
        }
        microcode = microcode + 4;
        EMIT_OP_REG_NUM(&ctx->ctx,o_add64,rEDI,num);
        EMIT_OP_REG_NUM(&ctx->ctx,o_mov,rECX,uVar2 >> 2);
        EMIT_OP(&ctx->ctx,o_rep_movsd);
        shift = shift + uVar2;
      }
      else if (uVar3 == 9) {
        xVar4 = CodeGenGenericContext::GetReg(&ctx->ctx);
        EMIT_OP_REG_RPTR(&ctx->ctx,o_mov64,xVar4,sQWORD,rEBP,shift);
        puVar1 = microcode + 1;
        microcode = microcode + 2;
        EMIT_OP_RPTR_REG(&ctx->ctx,o_mov64,sQWORD,rEBX,*puVar1 << 3,xVar4);
        shift = shift + 8;
      }
      else if (uVar3 == 8) {
        xVar4 = CodeGenGenericContext::GetReg(&ctx->ctx);
        EMIT_OP_REG_RPTR(&ctx->ctx,o_mov,xVar4,sDWORD,rEBP,shift);
        puVar1 = microcode + 1;
        microcode = microcode + 2;
        EMIT_OP_RPTR_REG(&ctx->ctx,o_mov,sDWORD,rEBX,*puVar1 << 3,xVar4);
        shift = shift + 4;
      }
      else {
        microcode = microcode + 1;
      }
      uVar3 = *microcode;
    } while (uVar3 != 7);
  }
  return;
}

Assistant:

void GetCodeCmdCallEpilogue(CodeGenRegVmContext &ctx, unsigned *microcode, unsigned char resultReg, unsigned char resultType)
{
#if defined(_M_X64)
	EMIT_OP_RPTR_NUM(ctx.ctx, o_sub64, sQWORD, rR13, nullcOffsetOf(ctx.vmState, callStackTop), sizeof(CodeGenRegVmCallStackEntry)); // vmState->callStackTop--;

	x86Reg rTempStack = rRBP;

	EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, rTempStack, sQWORD, rR13, nullcOffsetOf(ctx.vmState, tempStackArrayBase));

	x86Reg rTempReg = rRegCount;
	x86XmmReg rTempXmm = rXmmRegCount;

	switch(resultType)
	{
	case rvrDouble:
		rTempXmm = ctx.ctx.GetXmmReg();
		EMIT_OP_REG_RPTR(ctx.ctx, o_movsd, rTempXmm, sQWORD, rTempStack, 0);
		EMIT_OP_RPTR_REG(ctx.ctx, o_movsd, sQWORD, rREG, resultReg * 8, rTempXmm);
		break;
	case rvrLong:
		rTempReg = ctx.ctx.GetReg();
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, rTempReg, sQWORD, rTempStack, 0);
		EMIT_OP_RPTR_REG(ctx.ctx, o_mov64, sQWORD, rREG, resultReg * 8, rTempReg);
		break;
	case rvrInt:
		rTempReg = ctx.ctx.GetReg();
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rTempReg, sDWORD, rTempStack, 0);
		EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rREG, resultReg * 8, rTempReg);
		break;
	default:
		break;
	}

	unsigned tempStackPtrOffset = 0;

	while(*microcode != rvmiReturn)
	{
		switch(*microcode++)
		{
		case rvmiPop:
			rTempReg = ctx.ctx.GetReg();
			EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rTempReg, sDWORD, rTempStack, tempStackPtrOffset);
			EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rREG, *microcode++ * 8, rTempReg);
			tempStackPtrOffset += sizeof(int);
			break;
		case rvmiPopq:
			rTempReg = ctx.ctx.GetReg();
			EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, rTempReg, sQWORD, rTempStack, tempStackPtrOffset);
			EMIT_OP_RPTR_REG(ctx.ctx, o_mov64, sQWORD, rREG, *microcode++ * 8, rTempReg);
			tempStackPtrOffset += sizeof(long long);
			break;
		case rvmiPopMem:
		{
			unsigned reg = *microcode++;
			unsigned offset = *microcode++;
			unsigned size = *microcode++;

			EMIT_OP_REG_RPTR(ctx.ctx, o_lea, rRSI, sQWORD, rTempStack, tempStackPtrOffset);

			if(reg == rvrrFrame)
				EMIT_OP_REG_REG(ctx.ctx, o_mov64, rRDI, rR15);
			else if(reg == rvrrConstants)
				EMIT_OP_REG_REG(ctx.ctx, o_mov64, rRDI, rR14);
			else if(reg == rvrrRegisters)
				EMIT_OP_REG_REG(ctx.ctx, o_mov64, rRDI, rRBX);
			else
				EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, rRDI, sQWORD, rREG, reg * 8);

			EMIT_OP_REG_NUM(ctx.ctx, o_add64, rRDI, offset);
			EMIT_OP_REG_NUM(ctx.ctx, o_mov, rECX, size >> 2);
			EMIT_OP(ctx.ctx, o_rep_movsd);

			tempStackPtrOffset += size;
		}
		break;
		}
	}
#else
	//vmState->regFileLastPtr = prevRegFilePtr;
	EMIT_OP_ADDR_REG(ctx.ctx, o_mov, sDWORD, uintptr_t(&ctx.vmState->regFileLastPtr), rEBX);

	// Remove call stack frame
	EMIT_OP_RPTR_NUM(ctx.ctx, o_sub, sDWORD, uintptr_t(&ctx.vmState->callStackTop), sizeof(CodeGenRegVmCallStackEntry)); // vmState->callStackTop--;

	switch(resultType)
	{
	case rvrDouble:
	case rvrLong:
		EMIT_OP_REG_ADDR(ctx.ctx, o_mov, rEAX, sDWORD, uintptr_t(ctx.vmState->tempStackArrayBase));
		EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rREG, resultReg * 8, rEAX);
		EMIT_OP_REG_ADDR(ctx.ctx, o_mov, rEAX, sDWORD, uintptr_t(ctx.vmState->tempStackArrayBase) + 4);
		EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rREG, resultReg * 8 + 4, rEAX);
		break;
	case rvrInt:
		EMIT_OP_REG_ADDR(ctx.ctx, o_mov, rEAX, sDWORD, uintptr_t(ctx.vmState->tempStackArrayBase));
		EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rREG, resultReg * 8, rEAX);
		break;
	default:
		break;
	}

	unsigned tempStackPtrOffset = 0;

	while(*microcode != rvmiReturn)
	{
		switch(*microcode++)
		{
		case rvmiPop:
			EMIT_OP_REG_ADDR(ctx.ctx, o_mov, rEAX, sDWORD, uintptr_t(ctx.vmState->tempStackArrayBase) + tempStackPtrOffset);
			EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rREG, *microcode++ * 8, rEAX);
			tempStackPtrOffset += sizeof(int);
			break;
		case rvmiPopq:
			EMIT_OP_REG_ADDR(ctx.ctx, o_mov, rEAX, sDWORD, uintptr_t(ctx.vmState->tempStackArrayBase) + tempStackPtrOffset);
			EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rREG, *microcode * 8, rEAX);
			EMIT_OP_REG_ADDR(ctx.ctx, o_mov, rEAX, sDWORD, uintptr_t(ctx.vmState->tempStackArrayBase) + tempStackPtrOffset + 4);
			EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rREG, *microcode++ * 8 + 4, rEAX);
			tempStackPtrOffset += sizeof(long long);
			break;
		case rvmiPopMem:
		{
			unsigned reg = *microcode++;
			unsigned offset = *microcode++;
			unsigned size = *microcode++;

			EMIT_OP_REG_REG(ctx.ctx, o_mov, rEDX, rESI); // Save frame register
			EMIT_OP_REG_ADDR(ctx.ctx, o_lea, rESI, sDWORD, uintptr_t(ctx.vmState->tempStackArrayBase) + tempStackPtrOffset);
			EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEDI, sDWORD, rREG, reg * 8);
			EMIT_OP_REG_NUM(ctx.ctx, o_add, rEDI, offset);
			EMIT_OP_REG_NUM(ctx.ctx, o_mov, rECX, size >> 2);
			EMIT_OP(ctx.ctx, o_rep_movsd);
			EMIT_OP_REG_REG(ctx.ctx, o_mov, rESI, rEDX); // Restore frame register
			EMIT_REG_READ(ctx.ctx, rESI);

			tempStackPtrOffset += size;
		}
		break;
		}
	}
#endif
}